

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphml.hpp
# Opt level: O3

void __thiscall
bal::GraphMLWeightedStreamWriter::write_clauses(GraphMLWeightedStreamWriter *this,Cnf *value)

{
  ulong uVar1;
  _Base_ptr p_Var2;
  uint uVar3;
  ulong uVar4;
  ostream *poVar5;
  _Rb_tree_node_base *p_Var6;
  uint uVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  ulong uVar10;
  ulong uVar11;
  _Base_ptr p_Var12;
  uint *puVar13;
  uint uVar14;
  ulong uVar15;
  double dVar16;
  map<unsigned_long,_edge_data_t,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_edge_data_t>_>_>
  existing_edges;
  literal_t local_84;
  uint *local_80;
  pair<const_unsigned_long,_edge_data_t> local_78;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_edge_data_t>,_std::_Select1st<std::pair<const_unsigned_long,_edge_data_t>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_edge_data_t>_>_>
  local_60;
  
  poVar5 = (this->super_GraphMLStreamWriter).super_StreamWriter<bal::Cnf>.stream_;
  *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar10 = (ulong)(value->clauses_).size_;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (uVar10 != 0) {
    puVar13 = (value->clauses_).data_;
    local_80 = puVar13 + uVar10;
    do {
      uVar3 = *puVar13;
      uVar10 = (ulong)(uVar3 & 0xffff);
      if ((uVar3 & 0xffff) == 0) {
        uVar10 = 1;
      }
      else {
        uVar15 = 1;
        uVar11 = 0;
        do {
          uVar7 = (uint)uVar10;
          if (1 < uVar7) {
            uVar14 = 1;
            if (uVar7 < 4) {
              uVar14 = (uint)(ushort)(*(short *)(&DAT_00113d90 + (uVar3 >> 0x13 & 0x1e)) +
                                      *(short *)(&DAT_00113d90 + (uVar3 >> 0xf & 0x1e)) +
                                      *(short *)(&DAT_00113d90 + (uVar3 >> 0x17 & 0x1e)) +
                                     *(short *)(&DAT_00113d90 + (ulong)(uVar3 >> 0x1c) * 2));
            }
            if (uVar11 + 1 < (ulong)(uVar3 & 0xffff)) {
              dVar16 = ((double)(uVar14 * 2) / (double)uVar7) / (double)(int)(uVar7 - 1);
              uVar10 = uVar15;
              do {
                uVar4 = CONCAT44((puVar13[uVar10 + 1] >> 1) - 1,(puVar13[uVar11 + 1] >> 1) - 1);
                if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_0010da99:
                  local_78.first = uVar4;
                  local_78.second.cardinality = uVar14;
                  local_78.second.weight = dVar16;
                  std::
                  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,bal::GraphMLWeightedStreamWriter::write_clauses(bal::Cnf_const&)::edge_data_t>,std::_Select1st<std::pair<unsigned_long_const,bal::GraphMLWeightedStreamWriter::write_clauses(bal::Cnf_const&)::edge_data_t>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,bal::GraphMLWeightedStreamWriter::write_clauses(bal::Cnf_const&)::edge_data_t>>>
                  ::
                  _M_insert_unique<std::pair<unsigned_long_const,bal::GraphMLWeightedStreamWriter::write_clauses(bal::Cnf_const&)::edge_data_t>>
                            ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,bal::GraphMLWeightedStreamWriter::write_clauses(bal::Cnf_const&)::edge_data_t>,std::_Select1st<std::pair<unsigned_long_const,bal::GraphMLWeightedStreamWriter::write_clauses(bal::Cnf_const&)::edge_data_t>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,bal::GraphMLWeightedStreamWriter::write_clauses(bal::Cnf_const&)::edge_data_t>>>
                              *)&local_60,&local_78);
                }
                else {
                  p_Var9 = &local_60._M_impl.super__Rb_tree_header._M_header;
                  p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
                  do {
                    p_Var12 = p_Var2;
                    p_Var8 = p_Var9;
                    uVar1 = *(ulong *)(p_Var12 + 1);
                    p_Var9 = p_Var12;
                    if (uVar1 < uVar4) {
                      p_Var9 = p_Var8;
                    }
                    p_Var2 = (&p_Var12->_M_left)[uVar1 < uVar4];
                  } while ((&p_Var12->_M_left)[uVar1 < uVar4] != (_Base_ptr)0x0);
                  if ((_Rb_tree_header *)p_Var9 == &local_60._M_impl.super__Rb_tree_header)
                  goto LAB_0010da99;
                  if (uVar1 < uVar4) {
                    p_Var12 = p_Var8;
                  }
                  if (uVar4 < *(ulong *)(p_Var12 + 1)) goto LAB_0010da99;
                  *(uint *)&p_Var9[1]._M_parent = *(int *)&p_Var9[1]._M_parent + uVar14;
                  p_Var9[1]._M_left = (_Base_ptr)((double)p_Var9[1]._M_left + dVar16);
                }
                uVar10 = uVar10 + 1;
                uVar3 = *puVar13;
              } while (uVar10 < (uVar3 & 0xffff));
            }
          }
          uVar11 = uVar11 + 1;
          uVar10 = (ulong)(uVar3 & 0xffff);
          uVar15 = uVar15 + 1;
        } while (uVar11 < uVar10);
        uVar10 = (ulong)((uVar3 & 0xffff) + 1);
      }
      puVar13 = puVar13 + uVar10;
    } while (puVar13 < local_80);
    p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_60._M_impl.super__Rb_tree_header) {
      do {
        uVar10 = *(ulong *)(p_Var6 + 1);
        p_Var9 = p_Var6[1]._M_left;
        poVar5 = (this->super_GraphMLStreamWriter).super_StreamWriter<bal::Cnf>.stream_;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<edge source=\"v",0xf);
        if (0x7ffffffe < (uint)uVar10) {
LAB_0010dd47:
          __assert_fail("variableid <= VARIABLEID_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/base/variables.hpp"
                        ,0x11e,"bal::variable_t::variable_t(const variableid_t)");
        }
        local_78.first = CONCAT44(local_78.first._4_4_,(uint)uVar10 * 2 + 3);
        poVar5 = operator<<(poVar5,(literal_t *)&local_78);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" target=\"v",0xb);
        if (0x7ffffffe < (uint)(uVar10 >> 0x20)) goto LAB_0010dd47;
        local_84.id_ = (int)(uVar10 >> 0x1f) + 3;
        poVar5 = operator<<(poVar5,&local_84);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\">",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        poVar5 = (this->super_GraphMLStreamWriter).super_StreamWriter<bal::Cnf>.stream_;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"<data key=\"e_cardinality\">",0x1a);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"</data>",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->super_GraphMLStreamWriter).super_StreamWriter<bal::Cnf>.stream_,
                   "<data key=\"e_weight\">",0x15);
        poVar5 = std::ostream::_M_insert<double>((double)p_Var9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"</data>",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        poVar5 = (this->super_GraphMLStreamWriter).super_StreamWriter<bal::Cnf>.stream_;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"</edge>",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != &local_60._M_impl.super__Rb_tree_header);
    }
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_edge_data_t>,_std::_Select1st<std::pair<const_unsigned_long,_edge_data_t>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_edge_data_t>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

virtual void write_clauses(const Cnf& value) override {
            typedef struct {
                unsigned cardinality;
                double weight;
            } edge_data_t;
            
            stream() << std::dec;
            std::map<uint64_t, edge_data_t> existing_edges;
            
            const uint32_t* data = value.data();
            const uint32_t* data_end = data + value.data_size();
            while (data < data_end) {
                // iterate literal pairs
                // it is guaranteed that the sequence is sorted and no duplicates exist
                // weight is calculated such that the sum of weights of edges generated from a clause is 1
                for (auto i = 0; i < _clause_size(data); i++) {
                    if (_clause_size(data) > 1) {
                        uint16_t cardinality = 1;
                        if (_clause_size(data) < 4) {
                            cardinality = get_cardinality_uint16(_clause_flags(data));
                        };
                        
                        const double weight = 2.0 * cardinality / _clause_size(data) / (_clause_size(data) - 1);
                        
                        for (auto j = i + 1; j < _clause_size(data); j++) {
                            const variableid_t source = literal_t__variable_id(_clause_literal(data, i));
                            const variableid_t target = literal_t__variable_id(_clause_literal(data, j));
                            const uint64_t key = ((uint64_t)target << 32) | source;
                            
                            // check if the adge exists already; ignore if so, add otherwise
                            auto it = existing_edges.find(key);
                            if (it == existing_edges.end()) {
                                const edge_data_t edge_data{cardinality, weight};
                                existing_edges.insert({key, edge_data});
                            } else {
                                it->second.cardinality += cardinality;
                                it->second.weight += weight;
                            };
                        };
                    };
                };
                
                data += _clause_memory_size(data);
            };
            
            for (auto edge: existing_edges) {
                const variableid_t source = edge.first & 0xFFFFFFFF;
                const variableid_t target = edge.first >> 32;
                
                stream() << "<edge source=\"v" << literal_t(variable_t(source)) << "\" target=\"v" << literal_t(variable_t(target)) << "\">" << std::endl;
                stream() << "<data key=\"e_cardinality\">" << edge.second.cardinality << "</data>" << std::endl;
                stream() << "<data key=\"e_weight\">" << edge.second.weight << "</data>" << std::endl;
                stream() << "</edge>" << std::endl;
            };
        }